

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O2

bool __thiscall sf::Texture::loadFromImage(Texture *this,Image *image,IntRect *area)

{
  uint uVar1;
  uint width;
  bool bVar2;
  uint uVar3;
  Vector2u VVar4;
  Vector2u VVar5;
  Uint8 *pUVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  TransientContextLock lock;
  TextureSaver save;
  
  VVar4 = Image::getSize(image);
  VVar5 = Image::getSize(image);
  uVar1 = area->width;
  if ((uVar1 == 0) || (uVar11 = area->height, uVar11 == 0)) {
LAB_0016610d:
    VVar4 = Image::getSize(image);
    VVar5 = Image::getSize(image);
    bVar2 = create(this,VVar4.x,VVar5.y);
    if (!bVar2) {
      iVar9 = 0;
      goto LAB_00166148;
    }
    update(this,image);
  }
  else {
    iVar10 = area->left;
    iVar7 = area->top;
    uVar8 = VVar4.x;
    uVar3 = VVar5.y;
    if (((int)uVar3 <= (int)uVar11 && (int)uVar8 <= (int)uVar1) && (iVar7 < 1 && iVar10 < 1))
    goto LAB_0016610d;
    iVar9 = 0;
    if (iVar10 < 1) {
      iVar10 = 0;
    }
    if (iVar7 < 1) {
      iVar7 = iVar9;
    }
    width = uVar8 - iVar10;
    if ((int)(iVar10 + uVar1) <= (int)uVar8) {
      width = uVar1;
    }
    uVar1 = uVar3 - iVar7;
    if ((int)(iVar7 + uVar11) <= (int)uVar3) {
      uVar1 = uVar11;
    }
    bVar2 = create(this,width,uVar1);
    if (!bVar2) goto LAB_00166148;
    GlResource::TransientContextLock::TransientContextLock(&lock);
    priv::TextureSaver::TextureSaver(&save);
    pUVar6 = Image::getPixelsPtr(image);
    (*sf_glad_glBindTexture)(0xde1,this->m_texture);
    pUVar6 = pUVar6 + (int)((iVar7 * uVar8 + iVar10) * 4);
    uVar11 = 0;
    if ((int)uVar1 < 1) {
      uVar1 = uVar11;
    }
    for (; uVar1 != uVar11; uVar11 = uVar11 + 1) {
      (*sf_glad_glTexSubImage2D)(0xde1,0,0,uVar11,width,1,0x1908,0x1401,pUVar6);
      pUVar6 = pUVar6 + (int)(uVar8 << 2);
    }
    (*sf_glad_glTexParameteri)(0xde1,0x2801,this->m_isSmooth | 0x2600);
    this->m_hasMipmap = false;
    (*sf_glad_glFlush)();
    priv::TextureSaver::~TextureSaver(&save);
    GlResource::TransientContextLock::~TransientContextLock(&lock);
  }
  iVar9 = 1;
LAB_00166148:
  return SUB41(iVar9,0);
}

Assistant:

bool Texture::loadFromImage(const Image& image, const IntRect& area)
{
    // Retrieve the image size
    int width = static_cast<int>(image.getSize().x);
    int height = static_cast<int>(image.getSize().y);

    // Load the entire image if the source area is either empty or contains the whole image
    if (area.width == 0 || (area.height == 0) ||
       ((area.left <= 0) && (area.top <= 0) && (area.width >= width) && (area.height >= height)))
    {
        // Load the entire image
        if (create(image.getSize().x, image.getSize().y))
        {
            update(image);

            return true;
        }
        else
        {
            return false;
        }
    }
    else
    {
        // Load a sub-area of the image

        // Adjust the rectangle to the size of the image
        IntRect rectangle = area;
        if (rectangle.left   < 0) rectangle.left = 0;
        if (rectangle.top    < 0) rectangle.top  = 0;
        if (rectangle.left + rectangle.width > width)  rectangle.width  = width - rectangle.left;
        if (rectangle.top + rectangle.height > height) rectangle.height = height - rectangle.top;

        // Create the texture and upload the pixels
        if (create(static_cast<unsigned int>(rectangle.width), static_cast<unsigned int>(rectangle.height)))
        {
            TransientContextLock lock;

            // Make sure that the current texture binding will be preserved
            priv::TextureSaver save;

            // Copy the pixels to the texture, row by row
            const Uint8* pixels = image.getPixelsPtr() + 4 * (rectangle.left + (width * rectangle.top));
            glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
            for (int i = 0; i < rectangle.height; ++i)
            {
                glCheck(glTexSubImage2D(GL_TEXTURE_2D, 0, 0, i, rectangle.width, 1, GL_RGBA, GL_UNSIGNED_BYTE, pixels));
                pixels += 4 * width;
            }

            glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));
            m_hasMipmap = false;

            // Force an OpenGL flush, so that the texture will appear updated
            // in all contexts immediately (solves problems in multi-threaded apps)
            glCheck(glFlush());

            return true;
        }
        else
        {
            return false;
        }
    }
}